

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

BGwCI_sharedPtr __thiscall BayesianGameWithClusterInfo::Cluster(BayesianGameWithClusterInfo *this)

{
  BayesianGameIdenticalPayoff *pBVar1;
  _func_int **pp_Var2;
  pointer puVar3;
  _func_int *p_Var4;
  long *plVar5;
  long lVar6;
  pointer ppJVar7;
  JointBeliefInterface *pJVar8;
  long lVar9;
  undefined1 auVar10 [32];
  int iVar11;
  Index IVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar13;
  BayesianGameWithClusterInfo *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar14;
  size_type __n;
  ulong uVar15;
  undefined8 uVar16;
  undefined4 extraout_var_01;
  ulong uVar17;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  sp_counted_base *extraout_RDX_01;
  shared_count sVar18;
  BayesianGameWithClusterInfo *in_RSI;
  uint uVar19;
  Index jaI;
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  value_type extraout_XMM0_Qa;
  value_type vVar25;
  undefined1 auVar26 [32];
  BGwCI_sharedPtr BVar27;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  newTypeLists;
  vector<unsigned_int,_std::allocator<unsigned_int>_> previousTCI;
  TypeClusterList *newTypeList;
  ulong local_60;
  value_type local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrNewTypes;
  
  newTypeLists.
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newTypeLists.
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  newTypeLists.
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar1 = &(in_RSI->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  iVar11 = (*(in_RSI->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
             super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
             _vptr_Interface_ProblemToPolicyDiscrete[3])(pBVar1);
  newTypeList = (TypeClusterList *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&nrNewTypes,CONCAT44(extraout_var,iVar11),(value_type_conflict2 *)&newTypeList,
             (allocator_type *)&previousTCI);
  uVar19 = 0;
  while( true ) {
    iVar11 = (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
               super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
               _vptr_Interface_ProblemToPolicyDiscrete[3])(pBVar1);
    uVar17 = (ulong)uVar19;
    if (CONCAT44(extraout_var_00,iVar11) <= uVar17) break;
    newTypeList = (TypeClusterList *)operator_new(0x18);
    (newTypeList->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (newTypeList->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (newTypeList->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (newTypeLists.
        super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        newTypeLists.
        super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
      ::_M_realloc_insert<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*const&>
                ((vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
                  *)&newTypeLists,
                 (iterator)
                 newTypeLists.
                 super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&newTypeList);
    }
    else {
      *newTypeLists.
       super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = newTypeList;
      newTypeLists.
      super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           newTypeLists.
           super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    sVar13 = ConstructClusteredIndividualTypes(in_RSI,uVar19,newTypeList);
    if ((ulong)((long)nrNewTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)nrNewTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar17) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17)
      ;
    }
    nrNewTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = sVar13;
    uVar19 = uVar19 + 1;
  }
  this_00 = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
  BayesianGameWithClusterInfo
            (this_00,(in_RSI->super_BayesianGameForDecPOMDPStage)._m_pu,
             (in_RSI->super_BayesianGameForDecPOMDPStage)._m_qHeuristic,
             (in_RSI->super_BayesianGameForDecPOMDPStage).
             super_BayesianGameForDecPOMDPStageInterface._m_t,&in_RSI->_m_pBG,&in_RSI->_m_pBGJPol,
             (in_RSI->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrAgents,
             &(in_RSI->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrActions,
             &nrNewTypes,in_RSI->_m_clusterAlgorithm,in_RSI->_m_thresholdJB,
             in_RSI->_m_thresholdPjaoh);
  boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
            ((shared_ptr<BayesianGameWithClusterInfo> *)this,this_00);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::operator=((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
               *)((this->super_BayesianGameForDecPOMDPStage).
                  super_BayesianGameForDecPOMDPStageInterface.
                  _vptr_BayesianGameForDecPOMDPStageInterface + 0x33),&newTypeLists);
  uVar19 = 0;
  while( true ) {
    sVar13 = BayesianGameBase::GetNrJointTypes
                       ((BayesianGameBase *)
                        ((this->super_BayesianGameForDecPOMDPStage).
                         super_BayesianGameForDecPOMDPStageInterface.
                         _vptr_BayesianGameForDecPOMDPStageInterface + 4));
    uVar17 = (ulong)uVar19;
    if (sVar13 <= uVar17) {
      uVar19 = 0;
      while( true ) {
        iVar11 = (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                   super_Interface_ProblemToPolicyDiscretePure.
                   super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete
                   [3])(pBVar1);
        uVar17 = (ulong)uVar19;
        pp_Var2 = (this->super_BayesianGameForDecPOMDPStage).
                  super_BayesianGameForDecPOMDPStageInterface.
                  _vptr_BayesianGameForDecPOMDPStageInterface;
        if (CONCAT44(extraout_var_01,iVar11) <= uVar17) {
          (**(code **)(pp_Var2[4] + 0x78))(pp_Var2 + 4);
          sVar18.pi_ = extraout_RDX;
          if (nrNewTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(nrNewTypes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)nrNewTypes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)nrNewTypes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            sVar18.pi_ = extraout_RDX_00;
          }
          if (newTypeLists.
              super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(newTypeLists.
                            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)newTypeLists.
                                  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)newTypeLists.
                                  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            sVar18.pi_ = extraout_RDX_01;
          }
          BVar27.pn.pi_ = sVar18.pi_;
          BVar27.px = this;
          return BVar27;
        }
        if ((ulong)((long)pp_Var2[0x34] - (long)pp_Var2[0x33] >> 3) <= uVar17) break;
        plVar5 = *(long **)(pp_Var2[0x33] + uVar17 * 8);
        lVar6 = *plVar5;
        lVar9 = plVar5[1];
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar26._8_4_ = 8;
        auVar26._0_8_ = 0x800000008;
        auVar26._12_4_ = 8;
        auVar26._16_4_ = 8;
        auVar26._20_4_ = 8;
        auVar26._24_4_ = 8;
        auVar26._28_4_ = 8;
        if (lVar6 != lVar9) {
          auVar23 = vpbroadcastq_avx512f();
          auVar23 = vpsrlq_avx512f(auVar23,3);
          uVar17 = 0;
          auVar10 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
          do {
            auVar24 = vpbroadcastq_avx512f();
            auVar24 = vporq_avx512f(auVar24,auVar22);
            uVar20 = vpcmpuq_avx512f(auVar24,auVar23,2);
            auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(lVar6 + uVar17 * 8));
            auVar21._8_8_ = (ulong)((byte)(uVar20 >> 1) & 1) * auVar24._8_8_;
            auVar21._0_8_ = (ulong)((byte)uVar20 & 1) * auVar24._0_8_;
            auVar21._16_8_ = (ulong)((byte)(uVar20 >> 2) & 1) * auVar24._16_8_;
            auVar21._24_8_ = (ulong)((byte)(uVar20 >> 3) & 1) * auVar24._24_8_;
            vpscatterqd_avx512f(ZEXT832(0x30) + auVar21,uVar20,auVar10);
            uVar17 = uVar17 + 8;
            auVar10 = vpaddd_avx2(auVar10,auVar26);
          } while ((((lVar9 - lVar6) - 8U >> 3) + 8 & 0xfffffffffffffff8) != uVar17);
        }
        uVar19 = uVar19 + 1;
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17)
      ;
    }
    pvVar14 = BayesianGameBase::JointToIndividualTypeIndices
                        ((BayesianGameBase *)
                         ((this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameForDecPOMDPStageInterface.
                          _vptr_BayesianGameForDecPOMDPStageInterface + 4),uVar19);
    pp_Var2 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface
              ._vptr_BayesianGameForDecPOMDPStageInterface;
    __n = (**(code **)(pp_Var2[4] + 0x18))(pp_Var2 + 4);
    newTypeList = (TypeClusterList *)((ulong)newTypeList & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&previousTCI,__n,(value_type_conflict1 *)&newTypeList,(allocator_type *)&local_50);
    for (uVar20 = 0;
        pp_Var2 = (this->super_BayesianGameForDecPOMDPStage).
                  super_BayesianGameForDecPOMDPStageInterface.
                  _vptr_BayesianGameForDecPOMDPStageInterface,
        uVar15 = (**(code **)(pp_Var2[4] + 0x18))(pp_Var2 + 4), uVar20 < uVar15;
        uVar20 = (ulong)((int)uVar20 + 1)) {
      puVar3 = (pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar20) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pp_Var2 = (this->super_BayesianGameForDecPOMDPStage).
                super_BayesianGameForDecPOMDPStageInterface.
                _vptr_BayesianGameForDecPOMDPStageInterface;
      p_Var4 = pp_Var2[0x33];
      if ((ulong)((long)pp_Var2[0x34] - (long)p_Var4 >> 3) <= uVar20) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      uVar15 = (ulong)puVar3[uVar20];
      plVar5 = *(long **)(p_Var4 + uVar20 * 8);
      lVar6 = *plVar5;
      if ((ulong)(plVar5[1] - lVar6 >> 3) <= uVar15) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar15);
      }
      if ((ulong)((long)previousTCI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)previousTCI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar20) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      previousTCI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar20] = *(uint *)(*(long *)(lVar6 + uVar15 * 8) + 0x30);
    }
    vVar25 = extraout_XMM0_Qa;
    IVar12 = IndexTools::IndividualToJointIndicesStepSize
                       (&previousTCI,
                        (in_RSI->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface
                        .super_BayesianGameBase._m_stepSizeTypes);
    (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
      super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0xd])(pBVar1,(ulong)IVar12);
    pp_Var2 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface
              ._vptr_BayesianGameForDecPOMDPStageInterface;
    local_50 = vVar25;
    if (*(char *)(pp_Var2 + 5) == '\x01') {
      newTypeList = (TypeClusterList *)(pp_Var2 + 9);
      local_60 = uVar17;
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      ::set((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
             *)&newTypeList,&local_50);
    }
    else {
      *(value_type *)(pp_Var2[6] + uVar17 * 8) = vVar25;
    }
    uVar15 = (ulong)IVar12;
    ppJVar7 = (in_RSI->super_BayesianGameForDecPOMDPStage)._m_JBs.
              super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar20 = uVar15;
    if ((ulong)((long)(in_RSI->super_BayesianGameForDecPOMDPStage)._m_JBs.
                      super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar7 >> 3) <= uVar15)
    break;
    pJVar8 = ppJVar7[uVar15];
    if (pJVar8 != (JointBeliefInterface *)0x0) {
      uVar16 = (**(code **)((long)*pJVar8 + 0xb8))();
      pp_Var2 = (this->super_BayesianGameForDecPOMDPStage).
                super_BayesianGameForDecPOMDPStageInterface.
                _vptr_BayesianGameForDecPOMDPStageInterface;
      p_Var4 = pp_Var2[0x23];
      if ((ulong)((long)pp_Var2[0x24] - (long)p_Var4 >> 3) <= uVar17) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar17);
      }
      *(undefined8 *)(p_Var4 + uVar17 * 8) = uVar16;
    }
    if (in_RSI->_m_qJB == (QFunctionJointBeliefInterface *)0x0) {
      puVar3 = (in_RSI->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(in_RSI->_m_jaohReps).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar15) ||
         (pp_Var2 = (this->super_BayesianGameForDecPOMDPStage).
                    super_BayesianGameForDecPOMDPStageInterface.
                    _vptr_BayesianGameForDecPOMDPStageInterface, p_Var4 = pp_Var2[0x30],
         uVar20 = uVar17, (ulong)((long)pp_Var2[0x31] - (long)p_Var4 >> 2) <= uVar17)) break;
      *(uint *)(p_Var4 + uVar17 * 4) = puVar3[uVar15];
    }
    uVar20 = 0;
    while( true ) {
      sVar13 = BayesianGameBase::GetNrJointActions
                         ((BayesianGameBase *)
                          ((this->super_BayesianGameForDecPOMDPStage).
                           super_BayesianGameForDecPOMDPStageInterface.
                           _vptr_BayesianGameForDecPOMDPStageInterface + 4));
      if (sVar13 <= uVar20) break;
      (*(pBVar1->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x10])(pBVar1,(ulong)IVar12,uVar20);
      p_Var4 = (this->super_BayesianGameForDecPOMDPStage).
               super_BayesianGameForDecPOMDPStageInterface.
               _vptr_BayesianGameForDecPOMDPStageInterface[0x20];
      (**(code **)(*(long *)p_Var4 + 8))(p_Var4,uVar17,uVar20);
      uVar20 = (ulong)((int)uVar20 + 1);
    }
    if (previousTCI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(previousTCI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)previousTCI.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)previousTCI.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar19 = uVar19 + 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20);
}

Assistant:

BGwCI_sharedPtr  
BayesianGameWithClusterInfo::Cluster() 
{
    //first construct new clustered individual type set for each agent
    std::vector< TypeClusterList* > newTypeLists;
    std::vector< size_t > nrNewTypes(GetNrAgents(), 0);

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        //we create a new (empty) TypeClusterList for this agent.
        TypeClusterList* newTypeList = new TypeClusterList();
        newTypeLists.push_back(newTypeList);
        nrNewTypes.at(agI) = ConstructClusteredIndividualTypes(agI, 
                newTypeList);
    }

    BGwCI_sharedPtr bgc(new BayesianGameWithClusterInfo(
            GetPUDecPOMDPDiscrete(),
            GetQHeur(),
            GetStage(),
            _m_pBG,
            _m_pBGJPol,
            _m_nrAgents,
            _m_nrActions,
            nrNewTypes,
            _m_clusterAlgorithm,
            _m_thresholdJB,
            _m_thresholdPjaoh
                            ));

#if BGCLUSTER_OUTPUT_CLUSTERSTATS
    cout << GetStage() << " " << bgc->GetNrJointTypes()
         << "      stage " << GetStage()
         << " nrNewTypes " << SoftPrintVector(nrNewTypes)
         << " old nrJointTypes " << GetNrJointTypes()
         << " new nrJointTypes " << bgc->GetNrJointTypes()
         << endl;
#endif

    bgc->_m_typeLists = newTypeLists;


    //copy all the relevant stuff from the original BG (from *this*)
    //the the new clustered one (bgc)
    for(Index jtcI=0; jtcI < bgc->GetNrJointTypes(); jtcI++)
    {
        //find corresponding jtcI in the original BG (i.e., in this)
        const vector<Index>& indTypes = bgc->JointToIndividualTypeIndices(jtcI);
        vector<Index> previousTCI(bgc->GetNrAgents(), 0 );
        for(Index agI=0; agI < bgc->GetNrAgents(); agI++)
        {
            Index tcI = indTypes.at(agI);
            TypeClusterList* tcl = bgc->_m_typeLists.at(agI);
            TypeCluster* tc = tcl->at(tcI);
            Index previousIndexOfThisTC = tc->GetIndex();
            previousTCI.at(agI) = previousIndexOfThisTC;
        }
        Index previousjtcI = this->IndividualToJointTypeIndices(
                previousTCI);
        //
        double p = this->GetProbability(previousjtcI);
        bgc->SetProbability( jtcI, p);
        ///make a deep copy of the joint beliefs!
        //bgc->_m_JBs.at(jtcI) = this->_m_JBs.at(previousjtcI);
        if(this->_m_JBs.at(previousjtcI))
        {
            JointBeliefInterface* jbcopy =  (this->_m_JBs.at(previousjtcI))->Clone();
            bgc->_m_JBs.at(jtcI) = jbcopy;
        }

        // only maintain jaohRep if we are actually going to use them
        if(!_m_qJB)
            bgc->_m_jaohReps.at(jtcI) = this->_m_jaohReps.at(previousjtcI);

        for(Index jaI=0; jaI < bgc->GetNrJointActions(); jaI++)
        {
            double u = this->GetUtility(previousjtcI, jaI);
            bgc->SetUtility(jtcI, jaI, u);
        }

    }

    ///renumber the typeclusters for each agent
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {

        TypeClusterList* tcl = bgc->_m_typeLists.at(agI);
        Index i = 0;
        TypeClusterList::iterator it = tcl->begin();
        TypeClusterList::iterator last = tcl->end();
        while(it != last)
        {
            TypeCluster* tc = *it;
            tc->SetIndex(i);
            i++;
            it++;
        }
    }
      
    bgc->SanityCheck();
    

    return bgc;
    //return this;
}